

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               out,comm *comm)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long global_index;
  ulong uVar5;
  ulong uVar6;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  unsigned_long local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  block_decomposition<unsigned_long> local_48;
  
  if (comm->m_size == 1) {
    std::
    __copy_move_a<false,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (begin,end,out);
    return;
  }
  local_80 = (long)end._M_current - (long)begin._M_current >> 3;
  uVar4 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_80,comm);
  if (uVar4 != 0) {
    bVar2 = any_of(local_80 == uVar4,comm);
    if (bVar2) {
      impl::
      distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                (begin,end,out,uVar4,comm);
    }
    else {
      global_index = exscan<unsigned_long,std::plus<unsigned_long>>(&local_80,comm);
      local_48._vptr_block_decomposition = (_func_int **)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                 (long)comm->m_size,(value_type_conflict2 *)&local_48,(allocator_type *)&local_60);
      local_48._vptr_block_decomposition = (_func_int **)&PTR__block_decomposition_00164290;
      local_48.p = comm->m_size;
      local_48.rank = comm->m_rank;
      local_48.n = uVar4;
      iVar3 = partition::block_decomposition<unsigned_long>::target_processor
                        (&local_48,global_index);
      uVar4 = local_80;
      uVar6 = (long)iVar3;
      while ((uVar4 != 0 && ((long)uVar6 < (long)comm->m_size))) {
        uVar5 = local_48.n % (ulong)(long)local_48.p;
        uVar1 = uVar6 + 1;
        if (uVar1 <= uVar5) {
          uVar5 = uVar1;
        }
        uVar5 = ((local_48.n / (ulong)(long)local_48.p) * uVar1 - global_index) + uVar5;
        if (uVar4 < uVar5) {
          uVar5 = uVar4;
        }
        local_78._M_impl.super__Vector_impl_data._M_start[uVar6] = uVar5;
        uVar4 = uVar4 - uVar5;
        global_index = global_index + uVar5;
        uVar6 = uVar1;
      }
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,comm);
      all2allv<std::pair<int,int>>
                (begin._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78
                 ,out._M_current,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                 comm);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    std::size_t local_size = std::distance(begin, end);
    std::size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        std::size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        std::vector<size_t> send_counts(comm.size(), 0);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        int first_p = part.target_processor(prefix);
        std::size_t left_to_send = local_size;
        for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
            std::size_t nsend = std::min<std::size_t>(part.prefix_size(first_p) - prefix, left_to_send);
            send_counts[first_p] = nsend;
            left_to_send -= nsend;
            prefix += nsend;
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
    }
}